

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack9_24(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar1 = *(ulong *)in;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar1;
  auVar5 = vpshufd_avx(auVar3,0x54);
  auVar3 = vpinsrd_avx(auVar3,(uint)(uVar1 >> 9) & 0x7fffff,1);
  auVar4._8_4_ = 0x1ff;
  auVar4._0_8_ = 0x1ff000001ff;
  auVar4._12_4_ = 0x1ff;
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)out = auVar3._0_8_;
  out[2] = (uint)uVar1 >> 0x12 & 0x1ff;
  auVar6 = vpsrlvd_avx2(auVar5,_DAT_001a8ef0);
  uVar2 = (uint)(uVar1 >> 0x20);
  auVar3 = vpinsrd_avx(auVar4,(uVar2 & 0xf) << 5,0);
  auVar5 = vpor_avx(auVar6,auVar3);
  auVar3 = vpand_avx(auVar6,auVar4);
  auVar3 = vpblendd_avx2(auVar3,auVar5,1);
  *(undefined1 (*) [16])(out + 3) = auVar3;
  out[7] = uVar2 >> 0x1f;
  uVar1 = *(ulong *)(in + 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5 = vpshufd_avx(auVar5,0x54);
  out[7] = uVar2 >> 0x1f | ((uint)uVar1 & 0xff) << 1;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a8f00);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 8) = auVar3._0_8_;
  auVar6 = vpsrlvd_avx2(auVar5,_DAT_001a8f10);
  uVar2 = (uint)(uVar1 >> 0x20);
  auVar3 = vpinsrd_avx(auVar4,(uVar2 & 7) << 6,0);
  auVar5 = vpor_avx(auVar6,auVar3);
  auVar3 = vpand_avx(auVar6,auVar4);
  auVar3 = vpblendd_avx2(auVar3,auVar5,1);
  *(undefined1 (*) [16])(out + 10) = auVar3;
  uVar1 = *(ulong *)(in + 4);
  out[0xe] = uVar2 >> 0x1e;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  auVar5 = vpshufd_avx(auVar6,0x54);
  out[0xe] = uVar2 >> 0x1e | ((uint)uVar1 & 0x7f) << 2;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a8f20);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 0xf) = auVar3._0_8_;
  auVar6 = vpsrlvd_avx2(auVar5,_DAT_001a8f30);
  uVar2 = (uint)(uVar1 >> 0x20);
  auVar3 = vpinsrd_avx(auVar4,(uVar2 & 3) << 7,0);
  auVar5 = vpor_avx(auVar6,auVar3);
  auVar3 = vpand_avx(auVar6,auVar4);
  auVar3 = vpblendd_avx2(auVar3,auVar5,1);
  *(undefined1 (*) [16])(out + 0x11) = auVar3;
  out[0x15] = uVar2 >> 0x1d;
  out[0x15] = uVar2 >> 0x1d | (in[6] & 0x3f) << 3;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a8f40);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 0x16) = auVar3._0_8_;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack9_24(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 9);
  out++;
  *out = ((*in) >> 9) % (1U << 9);
  out++;
  *out = ((*in) >> 18) % (1U << 9);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 4)) << (9 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 9);
  out++;
  *out = ((*in) >> 13) % (1U << 9);
  out++;
  *out = ((*in) >> 22) % (1U << 9);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 8)) << (9 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 9);
  out++;
  *out = ((*in) >> 17) % (1U << 9);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 3)) << (9 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 9);
  out++;
  *out = ((*in) >> 12) % (1U << 9);
  out++;
  *out = ((*in) >> 21) % (1U << 9);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 7)) << (9 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 9);
  out++;
  *out = ((*in) >> 16) % (1U << 9);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 2)) << (9 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 9);
  out++;
  *out = ((*in) >> 11) % (1U << 9);
  out++;
  *out = ((*in) >> 20) % (1U << 9);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 6)) << (9 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 9);
  out++;
  *out = ((*in) >> 15) % (1U << 9);
  out++;

  return in + 1;
}